

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_crypt.c
# Opt level: O2

int gost_magma_cipher_init_mgm(EVP_CIPHER_CTX *ctx,uchar *key,uchar *iv,int enc)

{
  int iVar1;
  int iVar2;
  ossl_gost_cipher_ctx *c;
  
  c = (ossl_gost_cipher_ctx *)EVP_CIPHER_CTX_get_cipher_data();
  if (key != (uchar *)0x0 || iv != (uchar *)0x0) {
    if (key == (uchar *)0x0) {
      if (c[1].paramNID == 0) {
        memcpy(*(void **)(c[1].cctx.k87 + 0x15),iv,(long)(int)c[1].cctx.k87[0x17]);
      }
      else {
        iVar1 = gost_mgm128_setiv((mgm128_context *)&c[1].key_meshing,iv,
                                  (long)(int)c[1].cctx.k87[0x17]);
        if (iVar1 != 1) {
          return 0;
        }
      }
      c[1].count = 1;
    }
    else {
      iVar1 = EVP_CIPHER_CTX_get_iv_length(ctx);
      iVar2 = gost_cipher_set_param(c,0x3eb);
      if (iVar2 == 0) {
        return 0;
      }
      magma_key(&c->cctx,key);
      gost_mgm128_init((mgm128_context *)&c[1].key_meshing,c,gost_magma_encrypt_wrap,gf64_mul,iVar1)
      ;
      if ((iv != (uchar *)0x0) ||
         ((c[1].count != 0 && (iv = *(uchar **)(c[1].cctx.k87 + 0x15), iv != (uchar *)0x0)))) {
        iVar1 = gost_mgm128_setiv((mgm128_context *)&c[1].key_meshing,iv,
                                  (long)(int)c[1].cctx.k87[0x17]);
        if (iVar1 != 1) {
          return 0;
        }
        c[1].count = 1;
      }
      c[1].paramNID = 1;
    }
  }
  return 1;
}

Assistant:

static int gost_magma_cipher_init_mgm(EVP_CIPHER_CTX *ctx, const unsigned char *key,
                                 const unsigned char *iv, int enc)
{
    gost_mgm_ctx *mctx =
        (gost_mgm_ctx *)EVP_CIPHER_CTX_get_cipher_data(ctx);
    int bl;

    if (!iv && !key)
        return 1;
    if (key) {
        bl = EVP_CIPHER_CTX_iv_length(ctx);
        if (!gost_cipher_set_param(&mctx->ks.g_ks, NID_id_tc26_gost_28147_param_Z))
            return 0;
        magma_key(&(mctx->ks.g_ks.cctx), key);
        gost_mgm128_init(&mctx->mgm, &mctx->ks,
                         (block128_f) gost_magma_encrypt_wrap, gf64_mul, bl);

        /*
         * If we have an iv can set it directly, otherwise use saved IV.
         */
        if (iv == NULL && mctx->iv_set)
            iv = mctx->iv;
        if (iv) {
            if (gost_mgm128_setiv(&mctx->mgm, iv, mctx->ivlen) != 1)
                return 0;
            mctx->iv_set = 1;
        }
        mctx->key_set = 1;
    } else {
        /* If key set use IV, otherwise copy */
        if (mctx->key_set) {
            if (gost_mgm128_setiv(&mctx->mgm, iv, mctx->ivlen) != 1)
                return 0;
        }
        else
            memcpy(mctx->iv, iv, mctx->ivlen);
        mctx->iv_set = 1;
    }
    return 1;
}